

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_setfenv(lua_State *L)

{
  uint uVar1;
  TValue *pTVar2;
  lua_State *L_00;
  cTValue *g;
  ulong uVar3;
  lua_State *in_RDI;
  int level;
  cTValue *o;
  GCtab *t;
  GCfunc *fn;
  ErrMsg in_stack_ffffffffffffff68;
  ErrMsg in_stack_ffffffffffffff6c;
  lua_State *in_stack_ffffffffffffff70;
  
  L_00 = (lua_State *)lj_lib_checktab(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  g = in_RDI->base;
  if ((in_RDI->top <= g) || ((g->field_2).it != 0xfffffff7)) {
    in_stack_ffffffffffffff6c = lj_lib_checkint(L_00,(int)((ulong)g >> 0x20));
    if (in_stack_ffffffffffffff6c == LJ_ERR_ERRMEM) {
      (in_RDI->env).gcptr32 = (uint32_t)L_00;
      return 0;
    }
    if ((int)in_stack_ffffffffffffff6c < 0) {
      lj_err_arg((lua_State *)&g->field_2,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    }
    g = lj_debug_frame(in_RDI,in_stack_ffffffffffffff6c,(int *)&stack0xffffffffffffff6c);
    if (g == (cTValue *)0x0) {
      lj_err_arg((lua_State *)0x0,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    }
  }
  uVar1 = (g->u32).lo;
  uVar3 = (ulong)uVar1;
  if (*(char *)(uVar3 + 6) == '\0') {
    *(int *)(uVar3 + 8) = (int)L_00;
    if (((L_00->marked & 3) != 0) && ((*(byte *)(uVar3 + 4) & 4) != 0)) {
      lj_gc_barrierf((global_State *)&g->field_2,
                     (GCobj *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     (GCobj *)0x131627);
    }
    pTVar2 = in_RDI->top;
    in_RDI->top = pTVar2 + 1;
    (pTVar2->fr).func.gcptr32 = uVar1;
    (pTVar2->field_2).it = 0xfffffff7;
    return 1;
  }
  lj_err_caller((lua_State *)&g->field_2,in_stack_ffffffffffffff6c);
}

Assistant:

LJLIB_CF(setfenv)
{
  GCfunc *fn;
  GCtab *t = lj_lib_checktab(L, 2);
  cTValue *o = L->base;
  if (!(o < L->top && tvisfunc(o))) {
    int level = lj_lib_checkint(L, 1);
    if (level == 0) {
      /* NOBARRIER: A thread (i.e. L) is never black. */
      setgcref(L->env, obj2gco(t));
      return 0;
    }
    if (level < 0)
      lj_err_arg(L, 1, LJ_ERR_INVLVL);
    o = lj_debug_frame(L, level, &level);
    if (o == NULL)
      lj_err_arg(L, 1, LJ_ERR_INVLVL);
    if (LJ_FR2) o--;
  }
  fn = &gcval(o)->fn;
  if (!isluafunc(fn))
    lj_err_caller(L, LJ_ERR_SETFENV);
  setgcref(fn->l.env, obj2gco(t));
  lj_gc_objbarrier(L, obj2gco(fn), t);
  setfuncV(L, L->top++, fn);
  return 1;
}